

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void indigox::Options::AssignElectrons::Reset(void)

{
  long lVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  ALGORITHM = FPT;
  std::__cxx11::string::_M_replace
            (0x1457a8,0,(char *)ATOM_ENERGY_FILE_abi_cxx11_._M_string_length,0x1305bd);
  std::__cxx11::string::_M_replace
            (0x1457c8,0,(char *)BOND_ENERGY_FILE_abi_cxx11_._M_string_length,0x1305d7);
  INF = 0xffffffff;
  MAXIMUM_BOND_ORDER = 3;
  USE_ELECTRON_PAIRS = true;
  AUTO_USE_ELECTRON_PAIRS = true;
  USE_CHARGED_BOND_ENERGIES = false;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&ALLOWED_ELEMENTS_abi_cxx11_._M_t);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"H","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"C","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"N","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"O","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"S","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"P","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"F","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Cl","");
  plVar2 = local_38;
  local_48[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Br","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_assign_unique<std::__cxx11::string_const*>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&ALLOWED_ELEMENTS_abi_cxx11_,&local_148,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffffd8);
  lVar1 = -0x120;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0);
  HIGHEST_MAGNITUDE_CHARGE = 0;
  ALLOW_CHARGED_CARBON = true;
  MAXIMUM_RESULT_COUNT = 0;
  PREPLACE_ELECTRONS = true;
  AStar::HEURISTIC = ABSTEMIOUS;
  AStar::MEGABYTE_LIMIT = 0x1000;
  std::__cxx11::string::_M_replace
            (0x145828,0,(char *)FPT::LIBTW_JAR_FILE_abi_cxx11_._M_string_length,0x1305f9);
  FPT::ADD_EDGES_TO_TD = false;
  LocalOptimisation::OPTIMISE_ALL_MINIMUMS = true;
  LocalOptimisation::CACHE_RESULTS = true;
  LocalOptimisation::CACHE_INFINITIES = false;
  LocalOptimisation::TIMEOUT_LIMIT = 1000;
  return;
}

Assistant:

void assign_::Reset() {
  // AssignElectron general
  assign_::ALGORITHM = DFT_ASSIGNELECTRON_ALGORITHM;
  assign_::ATOM_ENERGY_FILE = DFT_ASSIGNELECTRON_ATOM_FILE;
  assign_::BOND_ENERGY_FILE = DFT_ASSIGNELECTRON_BOND_FILE;
  assign_::INF = DFT_ASSIGNELECTRON_INFINITY;
  assign_::MAXIMUM_BOND_ORDER = DFT_ASSIGNELECTRON_MAX_BOND_ORDER;
  assign_::USE_ELECTRON_PAIRS = DFT_ASSIGNELECTRON_USE_PAIRS;
  assign_::AUTO_USE_ELECTRON_PAIRS = DFT_ASSIGNELECTRON_AUTO_USE_PAIRS;
  assign_::USE_CHARGED_BOND_ENERGIES = DFT_ASSIGNELECTRON_CHARGED_BONDS;
  assign_::ALLOWED_ELEMENTS.clear();
  assign_::ALLOWED_ELEMENTS = {DFT_ASSIGNELECTRON_ALLOWED_ELEMENTS};
  assign_::HIGHEST_MAGNITUDE_CHARGE = DFT_ASSIGNELECTRON_HIGHEST_CHARGE;
  assign_::ALLOW_CHARGED_CARBON = DFT_ASSIGNELECTRON_ALLOW_CHARGE_CARBON;
  assign_::MAXIMUM_RESULT_COUNT = DFT_ASSIGNELECTRON_MAX_RESULT;
  assign_::PREPLACE_ELECTRONS = DFT_ASSIGNELECTRON_PREPLACE;
  
  // Reset all sub options
  astar_::Reset();
  fpt_::Reset();
  lo_::Reset();
}